

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall spv::Builder::accessChainLoad(Builder *this,Decoration precision,Id resultType)

{
  pointer ppIVar1;
  Instruction *pIVar2;
  Id IVar3;
  Id IVar4;
  pointer puVar5;
  pointer puVar6;
  ulong uVar7;
  long lVar8;
  Vector<unsigned_int> indexes;
  uint local_4c;
  _Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_48;
  
  if ((this->accessChain).isRValue == true) {
    transferAccessChainSwizzle(this,false);
    puVar5 = (this->accessChain).indexChain.
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    puVar6 = (this->accessChain).indexChain.
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish;
    if ((long)puVar6 - (long)puVar5 == 0) {
      IVar3 = (this->accessChain).base;
    }
    else {
      IVar3 = (this->accessChain).preSwizzleBaseType;
      if (IVar3 == 0) {
        IVar3 = resultType;
      }
      local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_finish = (uint *)0x0;
      local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
      if (0 < (int)((ulong)((long)puVar6 - (long)puVar5) >> 2)) {
        lVar8 = 0;
        do {
          ppIVar1 = (this->module).idToInstruction.
                    super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pIVar2 = ppIVar1[puVar5[lVar8]];
          if (pIVar2->opCode != OpConstant) {
            IVar3 = createVariableWithInitializer
                              (this,StorageClassFunction,ppIVar1[(this->accessChain).base]->typeId,0
                               ,"indexable");
            createStore(this,(this->accessChain).base,IVar3);
            (this->accessChain).base = IVar3;
            (this->accessChain).isRValue = false;
            IVar3 = collapseAccessChain(this);
            IVar3 = createLoad(this,IVar3);
            goto LAB_001b95ed;
          }
          local_4c = *(pIVar2->operands).
                      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          if (local_48._M_impl.super__Vector_impl_data._M_finish ==
              local_48._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
                       &local_48,(iterator)local_48._M_impl.super__Vector_impl_data._M_finish,
                       &local_4c);
            puVar5 = (this->accessChain).indexChain.
                     super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar6 = (this->accessChain).indexChain.
                     super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            *local_48._M_impl.super__Vector_impl_data._M_finish = local_4c;
            local_48._M_impl.super__Vector_impl_data._M_finish =
                 local_48._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < (int)((ulong)((long)puVar6 - (long)puVar5) >> 2));
      }
      IVar3 = createCompositeExtract
                        (this,(this->accessChain).base,IVar3,(Vector<unsigned_int> *)&local_48);
LAB_001b95ed:
      if ((precision != DecorationMax) && (IVar3 != 0)) {
        addDecoration(this,IVar3,precision,-1);
      }
      std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
                (&local_48);
    }
  }
  else {
    transferAccessChainSwizzle(this,true);
    IVar3 = collapseAccessChain(this);
    IVar3 = createLoad(this,IVar3);
    if (IVar3 != 0 && precision != DecorationMax) {
      addDecoration(this,IVar3,precision,-1);
    }
  }
  puVar5 = (this->accessChain).swizzle.
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (this->accessChain).swizzle.
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  IVar4 = (this->accessChain).component;
  if (puVar6 != puVar5 || IVar4 != 0) {
    if (puVar6 != puVar5) {
      IVar4 = getScalarTypeId(this,(this->module).idToInstruction.
                                   super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start[IVar3]->typeId);
      uVar7 = (long)(this->accessChain).swizzle.
                    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->accessChain).swizzle.
                    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2;
      if (1 < uVar7) {
        IVar4 = makeVectorType(this,IVar4,(int)uVar7);
      }
      IVar3 = createRvalueSwizzle(this,precision,IVar4,IVar3,&(this->accessChain).swizzle);
      IVar4 = (this->accessChain).component;
    }
    if (IVar4 != 0) {
      IVar3 = createVectorExtractDynamic(this,IVar3,resultType,IVar4);
      if ((precision != DecorationMax) && (IVar3 != 0)) {
        addDecoration(this,IVar3,precision,-1);
      }
    }
  }
  return IVar3;
}

Assistant:

Id Builder::accessChainLoad(Decoration precision, Id resultType)
{
    Id id;

    if (accessChain.isRValue) {
        // transfer access chain, but keep it static, so we can stay in registers
        transferAccessChainSwizzle(false);
        if (accessChain.indexChain.size() > 0) {
            Id swizzleBase = accessChain.preSwizzleBaseType != NoType ? accessChain.preSwizzleBaseType : resultType;

            // if all the accesses are constants, we can use OpCompositeExtract
            dxil_spv::Vector<unsigned> indexes;
            bool constant = true;
            for (int i = 0; i < (int)accessChain.indexChain.size(); ++i) {
                if (isConstantScalar(accessChain.indexChain[i]))
                    indexes.push_back(getConstantScalar(accessChain.indexChain[i]));
                else {
                    constant = false;
                    break;
                }
            }

            if (constant)
                id = createCompositeExtract(accessChain.base, swizzleBase, indexes);
            else {
                // make a new function variable for this r-value
                Id lValue = createVariable(StorageClassFunction, getTypeId(accessChain.base), "indexable");

                // store into it
                createStore(accessChain.base, lValue);

                // move base to the new variable
                accessChain.base = lValue;
                accessChain.isRValue = false;

                // load through the access chain
                id = createLoad(collapseAccessChain());
            }
            setPrecision(id, precision);
        } else
            id = accessChain.base;  // no precision, it was set when this was defined
    } else {
        transferAccessChainSwizzle(true);
        // load through the access chain
        id = createLoad(collapseAccessChain());
        setPrecision(id, precision);
    }

    // Done, unless there are swizzles to do
    if (accessChain.swizzle.size() == 0 && accessChain.component == NoResult)
        return id;

    // Do remaining swizzling
    // First, static swizzling
    if (accessChain.swizzle.size()) {
        // static swizzle
        Id swizzledType = getScalarTypeId(getTypeId(id));
        if (accessChain.swizzle.size() > 1)
            swizzledType = makeVectorType(swizzledType, (int)accessChain.swizzle.size());
        id = createRvalueSwizzle(precision, swizzledType, id, accessChain.swizzle);
    }

    // dynamic single-component selection
    if (accessChain.component != NoResult)
        id = setPrecision(createVectorExtractDynamic(id, resultType, accessChain.component), precision);

    return id;
}